

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

RealType __thiscall OpenMD::Molecule::getFixedCharge(Molecule *this)

{
  bool bVar1;
  Molecule *this_00;
  AtomType *AT;
  RealType RVar2;
  FixedChargeAdapter fca;
  AtomType *atomType;
  RealType q;
  iterator i;
  Atom *atom;
  FixedChargeAdapter in_stack_ffffffffffffffd0;
  double local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffe8;
  Molecule *in_stack_fffffffffffffff0;
  
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                       *)&stack0xffffffffffffffe8);
  local_20 = 0.0;
  for (this_00 = (Molecule *)
                 beginAtom(in_stack_fffffffffffffff0,
                           (iterator *)in_stack_ffffffffffffffe8._M_current);
      this_00 != (Molecule *)0x0;
      this_00 = (Molecule *)nextAtom(this_00,(iterator *)in_stack_ffffffffffffffe8._M_current)) {
    AT = Atom::getAtomType((Atom *)this_00);
    FixedChargeAdapter::FixedChargeAdapter((FixedChargeAdapter *)&stack0xffffffffffffffd0,AT);
    bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x2c2cd8);
    if (bVar1) {
      RVar2 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_ffffffffffffffd0.at_);
      local_20 = RVar2 + local_20;
    }
  }
  return local_20;
}

Assistant:

RealType Molecule::getFixedCharge() {
    Atom* atom;
    std::vector<Atom*>::iterator i;
    RealType q = 0.0;

    for (atom = beginAtom(i); atom != NULL; atom = nextAtom(i)) {
      AtomType* atomType = atom->getAtomType();

      FixedChargeAdapter fca = FixedChargeAdapter(atomType);
      if (fca.isFixedCharge()) { q += fca.getCharge(); }
    }

    return q;
  }